

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

void __thiscall
protozero::CopyablePtr<perfetto::protos::gen::JavaHprofConfig_ContinuousDumpConfig>::CopyablePtr
          (CopyablePtr<perfetto::protos::gen::JavaHprofConfig_ContinuousDumpConfig> *this,
          CopyablePtr<perfetto::protos::gen::JavaHprofConfig_ContinuousDumpConfig> *other)

{
  JavaHprofConfig_ContinuousDumpConfig *this_00;
  CopyablePtr<perfetto::protos::gen::JavaHprofConfig_ContinuousDumpConfig> *other_local;
  CopyablePtr<perfetto::protos::gen::JavaHprofConfig_ContinuousDumpConfig> *this_local;
  
  perfetto::std::
  unique_ptr<perfetto::protos::gen::JavaHprofConfig_ContinuousDumpConfig,_std::default_delete<perfetto::protos::gen::JavaHprofConfig_ContinuousDumpConfig>_>
  ::unique_ptr(&this->ptr_,&other->ptr_);
  this_00 = (JavaHprofConfig_ContinuousDumpConfig *)operator_new(0x40);
  perfetto::protos::gen::JavaHprofConfig_ContinuousDumpConfig::JavaHprofConfig_ContinuousDumpConfig
            (this_00);
  perfetto::std::
  unique_ptr<perfetto::protos::gen::JavaHprofConfig_ContinuousDumpConfig,_std::default_delete<perfetto::protos::gen::JavaHprofConfig_ContinuousDumpConfig>_>
  ::reset(&other->ptr_,this_00);
  return;
}

Assistant:

CopyablePtr(CopyablePtr&& other) noexcept : ptr_(std::move(other.ptr_)) {
    other.ptr_.reset(new T());
  }